

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# callback.h
# Opt level: O0

void __thiscall
google::protobuf::internal::MethodClosure0<google::protobuf::(anonymous_namespace)::ClosureTest>::
Run(MethodClosure0<google::protobuf::(anonymous_namespace)::ClosureTest> *this)

{
  bool bVar1;
  long *plVar2;
  code *local_38;
  bool needs_delete;
  MethodClosure0<google::protobuf::(anonymous_namespace)::ClosureTest> *this_local;
  
  bVar1 = this->self_deleting_;
  local_38 = (code *)this->method_;
  plVar2 = (long *)((long)&(this->object_->super_Test)._vptr_Test + *(long *)&this->field_0x18);
  if (((ulong)local_38 & 1) != 0) {
    local_38 = *(code **)(local_38 + *plVar2 + -1);
  }
  (*local_38)(plVar2);
  if (((bVar1 & 1U) != 0) &&
     (this != (MethodClosure0<google::protobuf::(anonymous_namespace)::ClosureTest> *)0x0)) {
    (*(this->super_Closure)._vptr_Closure[1])();
  }
  return;
}

Assistant:

void Run() override {
    bool needs_delete = self_deleting_;  // read in case callback deletes
    (object_->*method_)();
    if (needs_delete) delete this;
  }